

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++:52:10)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_threadlocal_test_c__:52:10)>
             *this)

{
  uint **ppuVar1;
  uint *puVar2;
  char *this_00;
  Impl<kj::(anonymous_namespace)::TestCase33::run()::__0> *this_01;
  uint *local_20;
  
  if (_::ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
      ::getKey()::key == '\0') {
    Function<void()>::Impl<kj::(anonymous_namespace)::TestCase33::run()::$_0>::operator()
              ((Impl<kj::(anonymous_namespace)::TestCase33::run()::__0> *)this);
  }
  this_00 = (char *)(ulong)_::
                           ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                           ::getKey()::key;
  puVar2 = (uint *)pthread_getspecific(_::
                                       ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                                       ::getKey()::key);
  *(this->f).p = puVar2;
  ppuVar1 = (this->f).p;
  if ((*ppuVar1 != (uint *)0x0) && (_::Debug::minSeverity < 3)) {
    local_20 = (uint *)0x0;
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
    ;
    _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x36,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
               (char (*) [34])"failed: expected (nullptr) == (p)",&local_20,ppuVar1);
  }
  puVar2 = (this->f).j;
  if (_::ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
      ::getKey()::key == '\0') {
    Function<void()>::Impl<kj::(anonymous_namespace)::TestCase33::run()::$_0>::operator()
              ((Impl<kj::(anonymous_namespace)::TestCase33::run()::__0> *)this_00);
  }
  this_01 = (Impl<kj::(anonymous_namespace)::TestCase33::run()::__0> *)
            (ulong)_::
                   ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                   ::getKey()::key;
  pthread_setspecific(_::
                      ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                      ::getKey()::key,puVar2);
  if (_::ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
      ::getKey()::key == '\0') {
    Function<void()>::Impl<kj::(anonymous_namespace)::TestCase33::run()::$_0>::operator()(this_01);
  }
  puVar2 = (uint *)pthread_getspecific(_::
                                       ThreadLocalPtr<unsigned_int,kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                                       ::getKey()::key);
  *(this->f).p = puVar2;
  ppuVar1 = (this->f).p;
  local_20 = (this->f).j;
  if ((local_20 != *ppuVar1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[29],unsigned_int*,unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x3a,ERROR,"\"failed: expected \" \"(&j) == (p)\", &j, p",
               (char (*) [29])"failed: expected (&j) == (p)",&local_20,ppuVar1);
  }
  *(this->f).threadDone = true;
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }